

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void pacf(double *vec,int N,double *par,int M)

{
  pacf_yw(vec,N,par,M);
  return;
}

Assistant:

void pacf(double* vec, int N, double* par, int M) {
	pacf_yw(vec, N, par, M);
	/*
	auto_fft_object obj;
	double *acorr;

	acorr = (double*)malloc(sizeof(double)* M);

	if (N < 50) {
	autocorr(vec, N, acorr, M);
	}
	else {
	obj = auto_fft_init(N);
	autocorr_fft(obj, vec, acorr, M);
	free_auto(obj);
	}

	free(acorr);
	*/
}